

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# kmp_ftn_entry.h
# Opt level: O2

void omp_get_place_proc_ids(int place_num,int *ids)

{
  kmp_affin_mask_t *pkVar1;
  kmp_affin_mask_t *pkVar2;
  long lVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  int iVar7;
  ulong uVar8;
  
  if (__kmp_init_middle == 0) {
    __kmp_middle_initialize();
  }
  pkVar2 = __kmp_affin_fullMask;
  pkVar1 = __kmp_affinity_masks;
  if ((-1 < place_num) && (place_num < (int)__kmp_affinity_num_masks)) {
    lVar3 = (uint)place_num * __kmp_affin_mask_size;
    uVar5 = __kmp_affin_mask_size << 3;
    iVar7 = 0;
    for (uVar6 = 0; uVar5 != uVar6; uVar6 = uVar6 + 1) {
      uVar8 = uVar6 >> 3 & 0x1fffffff;
      if (((pkVar2[uVar8] >> ((uint)uVar6 & 7) & 1) != 0) &&
         ((1 << ((byte)uVar6 & 7) & (uint)pkVar1[uVar8 + lVar3]) != 0)) {
        lVar4 = (long)iVar7;
        iVar7 = iVar7 + 1;
        ids[lVar4] = (uint)uVar6;
      }
    }
  }
  return;
}

Assistant:

void FTN_STDCALL
FTN_GET_PLACE_PROC_IDS( int place_num, int *ids )
{
    #if defined(KMP_STUB) || !KMP_AFFINITY_SUPPORTED
    // Nothing.
    #else
        int i,j;
        if ( ! TCR_4(__kmp_init_middle) ) {
            __kmp_middle_initialize();
        }
        if ( place_num < 0 || place_num >= (int)__kmp_affinity_num_masks )
            return;
        kmp_affin_mask_t *mask = KMP_CPU_INDEX(__kmp_affinity_masks, place_num);
        j = 0;
        KMP_CPU_SET_ITERATE(i, mask) {
            if ((! KMP_CPU_ISSET(i, __kmp_affin_fullMask)) ||
              (!KMP_CPU_ISSET(i, mask))) {
                continue;
            }
            ids[j++] = i;
        }
    #endif
}